

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train.c
# Opt level: O2

void do_find_parameter_C(void)

{
  double dVar1;
  double best_rate;
  double best_C;
  double local_28;
  undefined8 local_20;
  
  dVar1 = param.C;
  if (flag_C_specified == 0) {
    dVar1 = -1.0;
  }
  printf("Doing parameter search with %d-fold cross validation.\n",(ulong)(uint)nr_fold);
  find_parameter_C(dVar1,0x4090000000000000,&prob,&param,nr_fold,&local_20,&local_28);
  printf("Best C = %lf  CV accuracy = %g%%\n",local_20,local_28 * 100.0);
  return;
}

Assistant:

void do_find_parameter_C()
{
	double start_C, best_C, best_rate;
	double max_C = 1024;
	if (flag_C_specified)
		start_C = param.C;
	else
		start_C = -1.0;
	printf("Doing parameter search with %d-fold cross validation.\n", nr_fold);
	find_parameter_C(&prob, &param, nr_fold, start_C, max_C, &best_C, &best_rate);
	printf("Best C = %lf  CV accuracy = %g%%\n", best_C, 100.0*best_rate);
}